

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ParseTokenize(void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  u64 n;
  int iVar1;
  int iVar2;
  undefined8 *pOld;
  char *pcVar3;
  void *__s;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int rc;
  int local_3c;
  size_t local_38;
  
  local_3c = 0;
  if (*(int *)((long)pContext + 8) != 0) {
    return *(int *)((long)pContext + 8);
  }
  pOld = *pContext;
  iVar4 = 0x8000;
  if (nToken < 0x8000) {
    iVar4 = nToken;
  }
  if (pOld == (undefined8 *)0x0) {
    iVar2 = sqlite3_initialize();
    iVar5 = 7;
    if ((iVar2 != 0) || (pOld = (undefined8 *)sqlite3Malloc(0x140), pOld == (undefined8 *)0x0))
    goto LAB_001cfce6;
    pOld[6] = 0;
    pOld[7] = 0;
    pOld[4] = 0;
    pOld[5] = 0;
    pOld[2] = 0;
    pOld[3] = 0;
    *pOld = 0;
    pOld[1] = 0;
    iVar2 = 0;
LAB_001cfc3b:
    *(undefined8 **)pContext = pOld;
    *(int *)(pOld + 3) = iVar2;
  }
  else {
    iVar2 = *(int *)(pOld + 3);
    uVar6 = (ulong)iVar2;
    if ((tflags & 1U) != 0 && 0 < (long)uVar6) {
      iVar2 = sqlite3_initialize();
      iVar5 = 7;
      if (iVar2 == 0) {
        local_38 = (size_t)iVar4;
        n = local_38 + 0x31;
        __s = sqlite3Malloc(n);
        if (__s != (void *)0x0) {
          iVar5 = 0;
          memset(__s,0,n);
          *(void **)((long)__s + 8) = (void *)((long)__s + 0x30);
          memcpy((void *)((long)__s + 0x30),pToken,local_38);
          iVar4 = *(int *)(pOld + 3);
          *(undefined8 *)((long)__s + 0x18) = pOld[(long)iVar4 * 4 + 3];
          pOld[(long)iVar4 * 4 + 3] = __s;
        }
      }
      goto LAB_001cfce6;
    }
    if ((uVar6 & 7) == 0) {
      iVar1 = sqlite3_initialize();
      iVar5 = 7;
      if ((iVar1 != 0) ||
         (pOld = (undefined8 *)sqlite3Realloc(pOld,uVar6 * 0x20 + 0x140), pOld == (undefined8 *)0x0)
         ) goto LAB_001cfce6;
      goto LAB_001cfc3b;
    }
  }
  *(int *)(pOld + 3) = iVar2 + 1;
  lVar7 = (long)iVar2;
  pOld[lVar7 * 4 + 6] = 0;
  (pOld + lVar7 * 4 + 6)[1] = 0;
  pOld[lVar7 * 4 + 4] = 0;
  (pOld + lVar7 * 4 + 4)[1] = 0;
  pcVar3 = sqlite3Fts5Strndup(&local_3c,pToken,iVar4);
  pOld[lVar7 * 4 + 5] = pcVar3;
  iVar5 = local_3c;
LAB_001cfce6:
  *(int *)((long)pContext + 8) = iVar5;
  return iVar5;
}

Assistant:

static int fts5ParseTokenize(
  void *pContext,                 /* Pointer to Fts5InsertCtx object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  int rc = SQLITE_OK;
  const int SZALLOC = 8;
  TokenCtx *pCtx = (TokenCtx*)pContext;
  Fts5ExprPhrase *pPhrase = pCtx->pPhrase;

  UNUSED_PARAM2(iUnused1, iUnused2);

  /* If an error has already occurred, this is a no-op */
  if( pCtx->rc!=SQLITE_OK ) return pCtx->rc;
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;

  if( pPhrase && pPhrase->nTerm>0 && (tflags & FTS5_TOKEN_COLOCATED) ){
    Fts5ExprTerm *pSyn;
    sqlite3_int64 nByte = sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer) + nToken+1;
    pSyn = (Fts5ExprTerm*)sqlite3_malloc64(nByte);
    if( pSyn==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pSyn, 0, (size_t)nByte);
      pSyn->zTerm = ((char*)pSyn) + sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer);
      memcpy(pSyn->zTerm, pToken, nToken);
      pSyn->pSynonym = pPhrase->aTerm[pPhrase->nTerm-1].pSynonym;
      pPhrase->aTerm[pPhrase->nTerm-1].pSynonym = pSyn;
    }
  }else{
    Fts5ExprTerm *pTerm;
    if( pPhrase==0 || (pPhrase->nTerm % SZALLOC)==0 ){
      Fts5ExprPhrase *pNew;
      int nNew = SZALLOC + (pPhrase ? pPhrase->nTerm : 0);

      pNew = (Fts5ExprPhrase*)sqlite3_realloc64(pPhrase, 
          sizeof(Fts5ExprPhrase) + sizeof(Fts5ExprTerm) * nNew
      );
      if( pNew==0 ){
        rc = SQLITE_NOMEM;
      }else{
        if( pPhrase==0 ) memset(pNew, 0, sizeof(Fts5ExprPhrase));
        pCtx->pPhrase = pPhrase = pNew;
        pNew->nTerm = nNew - SZALLOC;
      }
    }

    if( rc==SQLITE_OK ){
      pTerm = &pPhrase->aTerm[pPhrase->nTerm++];
      memset(pTerm, 0, sizeof(Fts5ExprTerm));
      pTerm->zTerm = sqlite3Fts5Strndup(&rc, pToken, nToken);
    }
  }

  pCtx->rc = rc;
  return rc;
}